

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> other)

{
  const_pointer s1;
  const_pointer s2;
  unsigned_long *puVar1;
  size_type sVar2;
  size_type sVar3;
  int local_74;
  size_type local_40;
  size_type local_38;
  int local_2c;
  basic_string_view<char,_std::char_traits<char>_> *pbStack_28;
  int result;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> other_local;
  
  other_local.data_ = (const_pointer)other.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)other.data_;
  pbStack_28 = this;
  s1 = data(this);
  s2 = data((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_38 = size(this);
  local_40 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  puVar1 = std::min<unsigned_long>(&local_38,&local_40);
  local_2c = detail::compare(s1,s2,*puVar1);
  other_local.size_._4_4_ = local_2c;
  if (local_2c == 0) {
    sVar2 = size(this);
    sVar3 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar2 == sVar3) {
      local_74 = 0;
    }
    else {
      sVar2 = size(this);
      sVar3 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      local_74 = 1;
      if (sVar2 < sVar3) {
        local_74 = -1;
      }
    }
    other_local.size_._4_4_ = local_74;
  }
  return other_local.size_._4_4_;
}

Assistant:

nssv_constexpr14 int compare( basic_string_view other ) const nssv_noexcept // (1)
    {
#if nssv_CPP17_OR_GREATER
        if ( const int result = Traits::compare( data(), other.data(), (std::min)( size(), other.size() ) ) )
#else
        if ( const int result = detail::compare( data(), other.data(), (std::min)( size(), other.size() ) ) )
#endif
        {
            return result;
        }

        return size() == other.size() ? 0 : size() < other.size() ? -1 : 1;
    }